

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::
     PrintValue<phmap::parallel_node_hash_map<phmap::priv::NonStandardLayout,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>,4ul,phmap::NullMutex>,void>
               (parallel_node_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
                *container,ostream *os)

{
  pair<const_phmap::priv::NonStandardLayout,_int> *value;
  bool bVar1;
  long lVar2;
  const_iterator __begin0;
  char local_61;
  iterator local_60;
  
  local_60.inner_._0_1_ = 0x7b;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_60,1);
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::begin((const_iterator *)&local_60,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
           *)container);
  if (CONCAT71(local_60.inner_._1_7_,local_60.inner_._0_1_) != 0) {
    lVar2 = 0;
    do {
      value = *local_60.it_.field_1.slot_;
      if (lVar2 == 0) {
LAB_0014fa6b:
        local_61 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_61,1);
        PrintTo<phmap::priv::NonStandardLayout_const,int>(value,os);
        lVar2 = lVar2 + 1;
        bVar1 = true;
      }
      else {
        local_61 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_61,1);
        if (lVar2 != 0x20) goto LAB_0014fa6b;
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        lVar2 = 0x20;
        bVar1 = false;
      }
      if (!bVar1) break;
      phmap::priv::
      parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ::iterator::operator++(&local_60);
    } while (CONCAT71(local_60.inner_._1_7_,local_60.inner_._0_1_) != 0);
    if (lVar2 != 0) {
      local_60.inner_._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_60,1);
    }
  }
  local_60.inner_._0_1_ = 0x7d;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_60,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }